

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtx_loadDictionary_advanced
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
                 ZSTD_dictContentType_e dictContentType)

{
  void *__dest;
  
  if (cctx->streamStage != zcss_init) {
    return 0xffffffffffffffc4;
  }
  ZSTD_customFree((cctx->localDict).dictBuffer,cctx->customMem);
  ZSTD_freeCDict((cctx->localDict).cdict);
  (cctx->localDict).dictBuffer = (void *)0x0;
  (cctx->localDict).dict = (void *)0x0;
  (cctx->localDict).dictSize = 0;
  *(undefined8 *)&(cctx->localDict).dictContentType = 0;
  (cctx->localDict).cdict = (ZSTD_CDict *)0x0;
  cctx->cdict = (ZSTD_CDict *)0x0;
  (cctx->prefixDict).dict = (void *)0x0;
  (cctx->prefixDict).dictSize = 0;
  *(undefined8 *)&(cctx->prefixDict).dictContentType = 0;
  if (dictSize != 0 && dict != (void *)0x0) {
    __dest = dict;
    if (dictLoadMethod != ZSTD_dlm_byRef) {
      if (cctx->staticSize != 0) {
        return 0xffffffffffffffc0;
      }
      __dest = ZSTD_customMalloc(dictSize,cctx->customMem);
      if (__dest == (void *)0x0) {
        return 0xffffffffffffffc0;
      }
      memcpy(__dest,dict,dictSize);
      (cctx->localDict).dictBuffer = __dest;
    }
    (cctx->localDict).dict = __dest;
    (cctx->localDict).dictSize = dictSize;
    (cctx->localDict).dictContentType = dictContentType;
  }
  return 0;
}

Assistant:

size_t ZSTD_CCtx_loadDictionary_advanced(
        ZSTD_CCtx* cctx, const void* dict, size_t dictSize,
        ZSTD_dictLoadMethod_e dictLoadMethod, ZSTD_dictContentType_e dictContentType)
{
    RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                    "Can't load a dictionary when ctx is not in init stage.");
    DEBUGLOG(4, "ZSTD_CCtx_loadDictionary_advanced (size: %u)", (U32)dictSize);
    ZSTD_clearAllDicts(cctx);  /* in case one already exists */
    if (dict == NULL || dictSize == 0)  /* no dictionary mode */
        return 0;
    if (dictLoadMethod == ZSTD_dlm_byRef) {
        cctx->localDict.dict = dict;
    } else {
        void* dictBuffer;
        RETURN_ERROR_IF(cctx->staticSize, memory_allocation,
                        "no malloc for static CCtx");
        dictBuffer = ZSTD_customMalloc(dictSize, cctx->customMem);
        RETURN_ERROR_IF(!dictBuffer, memory_allocation, "NULL pointer!");
        ZSTD_memcpy(dictBuffer, dict, dictSize);
        cctx->localDict.dictBuffer = dictBuffer;
        cctx->localDict.dict = dictBuffer;
    }
    cctx->localDict.dictSize = dictSize;
    cctx->localDict.dictContentType = dictContentType;
    return 0;
}